

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetSpike
          (NESTcalc *this,int Nph,double dx,double dy,double dz,double driftSpeed,double dS_mid,
          vector<double,_std::allocator<double>_> *oldScint)

{
  double *pdVar1;
  pointer pdVar2;
  VDetector *pVVar3;
  RandomGen *this_00;
  double *__s;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  __s = (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,((long)pdVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  pdVar2 = (oldScint->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2[7] <= 120.0) {
    this_00 = RandomGen::rndm();
    dVar4 = (oldScint->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[6];
    dVar4 = RandomGen::rand_zero_trunc_gauss
                      (this_00,dVar4,SQRT(ABS(dVar4)) * this->fdetector->sPEres * 0.25);
    *(this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = dVar4;
    (*this->fdetector->_vptr_VDetector[3])(dx,dy,dz,this->fdetector,1);
    pVVar3 = this->fdetector;
    (*pVVar3->_vptr_VDetector[3])(0,0,pVVar3->TopDrift - dS_mid * pVVar3->dtCntr,pVVar3,1);
    dVar4 = extraout_XMM0_Qa_00 * (dVar4 / extraout_XMM0_Qa);
    __s = (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  else {
    *__s = pdVar2[4];
    dVar4 = pdVar2[5];
  }
  __s[1] = dVar4;
  return &this->newSpike;
}

Assistant:

const vector<double> &NESTcalc::GetSpike(int Nph, double dx, double dy,
                                         double dz, double driftSpeed,
                                         double dS_mid,
                                         const vector<double> &oldScint) {
  std::fill(newSpike.begin(), newSpike.end(), 0);

  if (oldScint[7] > SPIKES_MAXM) {
    newSpike[0] = oldScint[4];
    newSpike[1] = oldScint[5];
    return newSpike;
  }
  newSpike[0] = RandomGen::rndm()->rand_zero_trunc_gauss(
      oldScint[6],
      (fdetector->get_sPEres() / 4.) * sqrt(std::abs(oldScint[6])));
  if (XYcorr == 0 || XYcorr == 2) {
    dx = 0.;
    dy = 0.;
  }
  newSpike[1] =
      newSpike[0] / fdetector->FitS1(dx, dy, dz, VDetector::unfold) *
      fdetector->FitS1(
          0., 0., fdetector->get_TopDrift() - dS_mid * fdetector->get_dtCntr(),
          VDetector::unfold);

  return newSpike;  // regular and position-corrected spike counts returned
}